

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

pair<int,_double>
mxx::scatter_one<std::pair<int,double>>
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *msgs,int root,
          comm *comm)

{
  int iVar1;
  size_type sVar2;
  const_reference msgs_00;
  pair<int,_double> pVar3;
  comm *comm_local;
  int root_local;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *msgs_local;
  pair<int,_double> result;
  
  iVar1 = mxx::comm::rank(comm);
  if (iVar1 == root) {
    sVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      (msgs);
    iVar1 = mxx::comm::size(comm);
    if (sVar2 != (long)iVar1) {
      assert_fail("comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                  ,0xfe,"scatter_one");
    }
  }
  std::pair<int,_double>::pair<int,_double,_true>((pair<int,_double> *)&msgs_local);
  msgs_00 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
            operator[](msgs,0);
  scatter<std::pair<int,double>>(msgs_00,1,(pair<int,_double> *)&msgs_local,root,comm);
  pVar3._4_4_ = 0;
  pVar3.first = (uint)msgs_local;
  pVar3.second = (double)result._0_8_;
  return pVar3;
}

Assistant:

T scatter_one(const std::vector<T>& msgs, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size()));
    T result;
    scatter(&msgs[0], 1, &result, root, comm);
    return result;
}